

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::SkipFallback
          (CodedInputStream *this,int count,int original_buffer_size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int bytes_until_limit;
  int closest_limit;
  int original_buffer_size_local;
  int count_local;
  CodedInputStream *this_local;
  
  if (this->buffer_size_after_limit_ < 1) {
    uVar1 = count - original_buffer_size;
    this->buffer_ = (uint8_t *)0x0;
    this->buffer_end_ = this->buffer_;
    piVar4 = std::min<int>(&this->current_limit_,&this->total_bytes_limit_);
    uVar2 = *piVar4 - this->total_bytes_read_;
    if ((int)uVar2 < (int)uVar1) {
      if (0 < (int)uVar2) {
        this->total_bytes_read_ = *piVar4;
        (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar2);
      }
      this_local._7_1_ = false;
    }
    else {
      uVar2 = (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar1);
      if ((uVar2 & 1) == 0) {
        iVar3 = (*this->input_->_vptr_ZeroCopyInputStream[5])();
        this->total_bytes_read_ = iVar3;
        this_local._7_1_ = false;
      }
      else {
        this->total_bytes_read_ = uVar1 + this->total_bytes_read_;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    Advance(this,original_buffer_size);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::SkipFallback(int count, int original_buffer_size) {
  if (buffer_size_after_limit_ > 0) {
    // We hit a limit inside this buffer.  Advance to the limit and fail.
    Advance(original_buffer_size);
    return false;
  }

  count -= original_buffer_size;
  buffer_ = NULL;
  buffer_end_ = buffer_;

  // Make sure this skip doesn't try to skip past the current limit.
  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  int bytes_until_limit = closest_limit - total_bytes_read_;
  if (bytes_until_limit < count) {
    // We hit the limit.  Skip up to it then fail.
    if (bytes_until_limit > 0) {
      total_bytes_read_ = closest_limit;
      input_->Skip(bytes_until_limit);
    }
    return false;
  }

  if (!input_->Skip(count)) {
    total_bytes_read_ = input_->ByteCount();
    return false;
  }
  total_bytes_read_ += count;
  return true;
}